

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cepstrum_to_minimum_phase_impulse_response.cc
# Opt level: O0

bool __thiscall
sptk::CepstrumToMinimumPhaseImpulseResponse::Run
          (CepstrumToMinimumPhaseImpulseResponse *this,
          vector<double,_std::allocator<double>_> *cepstrum,
          vector<double,_std::allocator<double>_> *minimum_phase_impulse_response)

{
  size_type sVar1;
  const_reference pvVar2;
  reference pvVar3;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  double dVar4;
  int k;
  int end;
  double sum;
  int n;
  double *h;
  double *c;
  int local_54;
  int local_48;
  double local_40;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar5;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffd0;
  bool local_1;
  
  if ((((*(byte *)(in_RDI + 0x10) & 1) == 0) ||
      (sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
      sVar1 != (long)(*(int *)(in_RDI + 8) + 1))) ||
     (in_RDX == (vector<double,_std::allocator<double>_> *)0x0)) {
    local_1 = false;
  }
  else {
    sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
    if (sVar1 != (long)(*(int *)(in_RDI + 0xc) + 1)) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffffd0,
                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
    dVar4 = exp(*pvVar2);
    *pvVar3 = dVar4;
    for (iVar5 = 1; iVar5 <= *(int *)(in_RDI + 0xc); iVar5 = iVar5 + 1) {
      local_40 = 0.0;
      local_54 = iVar5;
      if (*(int *)(in_RDI + 8) < iVar5) {
        local_54 = *(int *)(in_RDI + 8);
      }
      for (local_48 = 1; local_48 <= local_54; local_48 = local_48 + 1) {
        local_40 = (double)local_48 * pvVar2[local_48] * pvVar3[iVar5 - local_48] + local_40;
      }
      pvVar3[iVar5] = local_40 / (double)iVar5;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool CepstrumToMinimumPhaseImpulseResponse::Run(
    const std::vector<double>& cepstrum,
    std::vector<double>* minimum_phase_impulse_response) const {
  // Check inputs.
  if (!is_valid_ ||
      cepstrum.size() != static_cast<std::size_t>(num_input_order_ + 1) ||
      NULL == minimum_phase_impulse_response) {
    return false;
  }

  // Prepare memories.
  if (minimum_phase_impulse_response->size() !=
      static_cast<std::size_t>(num_output_order_ + 1)) {
    minimum_phase_impulse_response->resize(num_output_order_ + 1);
  }

  const double* c(&cepstrum[0]);
  double* h(&((*minimum_phase_impulse_response)[0]));

  h[0] = std::exp(c[0]);
  for (int n(1); n <= num_output_order_; ++n) {
    double sum(0.0);
    const int end((num_input_order_ < n) ? num_input_order_ : n);
    for (int k(1); k <= end; ++k) {
      sum += k * c[k] * h[n - k];
    }
    h[n] = sum / n;
  }

  return true;
}